

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::ne(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  double dVar1;
  double dVar2;
  BasicType BVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  
  BVar3 = wasm::Type::getBasic(&this->type);
  switch(BVar3) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x53c);
  case i32:
    bVar4 = (this->field_0).i32 == (other->field_0).i32;
    break;
  case i64:
    bVar4 = (this->field_0).i64 == (other->field_0).i64;
    break;
  case f32:
    fVar5 = getf32(this);
    fVar6 = getf32(other);
    bVar4 = fVar6 != fVar5;
    goto LAB_009cc360;
  case f64:
    dVar1 = getf64(this);
    dVar2 = getf64(other);
    bVar4 = dVar2 != dVar1;
LAB_009cc360:
    bVar4 = (bool)(-bVar4 & 1);
    goto LAB_009cc36e;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x53e);
  }
  bVar4 = !bVar4;
LAB_009cc36e:
  *(uint *)&__return_storage_ptr__->field_0 = (uint)bVar4;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::ne(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 != other.i32);
    case Type::i64:
      return Literal(i64 != other.i64);
    case Type::f32:
      return Literal(getf32() != other.getf32());
    case Type::f64:
      return Literal(getf64() != other.getf64());
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}